

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O2

void readheader(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int status;
  fitsfile *fptr;
  int nkeys;
  int hdutype;
  int keypos;
  char filename [13];
  char card [81];
  
  builtin_strncpy(filename + 8,".fit",5);
  builtin_strncpy(filename,"atestfil",8);
  status = 0;
  iVar1 = ffopentest(10,&fptr,filename,0);
  if (iVar1 != 0) {
    printerror(status);
  }
  uVar3 = 1;
  while( true ) {
    iVar1 = ffmahd(fptr,uVar3,&hdutype,&status);
    if (iVar1 != 0) break;
    iVar1 = ffghps(fptr,&nkeys,&keypos,&status);
    if (iVar1 != 0) {
      printerror(status);
    }
    printf("Header listing for HDU #%d:\n",(ulong)uVar3);
    for (iVar1 = 1; iVar1 <= nkeys; iVar1 = iVar1 + 1) {
      iVar2 = ffgrec(fptr,iVar1,card,&status);
      if (iVar2 != 0) {
        printerror(status);
      }
      puts(card);
    }
    puts("END\n");
    uVar3 = uVar3 + 1;
  }
  if (status == 0x6b) {
    status = 0;
  }
  else {
    printerror(status);
  }
  iVar1 = ffclos(fptr,&status);
  if (iVar1 != 0) {
    printerror(status);
  }
  return;
}

Assistant:

void readheader ( void )

    /**********************************************************************/
    /* Print out all the header keywords in all extensions of a FITS file */
    /**********************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */

    int status, nkeys, keypos, hdutype, ii, jj;
    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */
    char card[FLEN_CARD];   /* standard string lengths defined in fitsioc.h */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) ) 
         printerror( status );

    /* attempt to move to next HDU, until we get an EOF error */
    for (ii = 1; !(fits_movabs_hdu(fptr, ii, &hdutype, &status) ); ii++) 
    {
        /* get no. of keywords */
        if (fits_get_hdrpos(fptr, &nkeys, &keypos, &status) )
            printerror( status );

        printf("Header listing for HDU #%d:\n", ii);
        for (jj = 1; jj <= nkeys; jj++)  {
            if ( fits_read_record(fptr, jj, card, &status) )
                 printerror( status );

            printf("%s\n", card); /* print the keyword card */
        }
        printf("END\n\n");  /* terminate listing with END */
    }

    if (status == END_OF_FILE)   /* status values are defined in fitsioc.h */
        status = 0;              /* got the expected EOF error; reset = 0  */
    else
       printerror( status );     /* got an unexpected error                */

    if ( fits_close_file(fptr, &status) )
         printerror( status );

    return;
}